

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControllerWidget::mousePressEvent(ControllerWidget *this,QMouseEvent *event)

{
  SubControl SVar1;
  long in_FS_OFFSET;
  QPointF local_28;
  QPoint local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 1) {
    local_28 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_18 = QPointF::toPoint(&local_28);
    SVar1 = getSubControl(this,&local_18);
    this->activeControl = SVar1;
    QWidget::update(&this->super_QWidget);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }
    activeControl = getSubControl(event->position().toPoint());
    update();
}